

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftp.c
# Opt level: O3

CURLcode tftp_set_timeouts(tftp_state_data *state)

{
  undefined1 auVar1 [16];
  int iVar2;
  timediff_t tVar3;
  ulong uVar4;
  int iVar5;
  CURLcode CVar6;
  
  tVar3 = Curl_timeleft(state->data,(curltime *)0x0,state->state == TFTP_STATE_START);
  if (tVar3 < 0) {
    Curl_failf(state->data,"Connection time-out");
    CVar6 = CURLE_OPERATION_TIMEDOUT;
  }
  else {
    if (tVar3 == 0) {
      uVar4 = 0xe10;
    }
    else {
      uVar4 = (tVar3 + 500U) / 1000;
    }
    iVar5 = (int)uVar4 / 5;
    iVar2 = 0x32;
    if (iVar5 < 0x32) {
      iVar2 = iVar5;
    }
    iVar5 = 3;
    if (0xe < (int)uVar4) {
      iVar5 = iVar2;
    }
    state->retry_max = iVar5;
    CVar6 = CURLE_OK;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar4;
    iVar2 = SUB164(auVar1 / SEXT816((long)iVar5),0);
    iVar5 = 1;
    if (1 < iVar2) {
      iVar5 = iVar2;
    }
    state->retry_time = iVar5;
    Curl_infof(state->data,"set timeouts for state %d; Total % ld, retry %d maxtry %d",
               (ulong)state->state);
    time(&state->rx_time);
  }
  return CVar6;
}

Assistant:

static CURLcode tftp_set_timeouts(struct tftp_state_data *state)
{
  time_t maxtime, timeout;
  timediff_t timeout_ms;
  bool start = (state->state == TFTP_STATE_START) ? TRUE : FALSE;

  /* Compute drop-dead time */
  timeout_ms = Curl_timeleft(state->data, NULL, start);

  if(timeout_ms < 0) {
    /* time-out, bail out, go home */
    failf(state->data, "Connection time-out");
    return CURLE_OPERATION_TIMEDOUT;
  }

  if(timeout_ms > 0)
    maxtime = (time_t)(timeout_ms + 500) / 1000;
  else
    maxtime = 3600; /* use for calculating block timeouts */

  /* Set per-block timeout to total */
  timeout = maxtime;

  /* Average reposting an ACK after 5 seconds */
  state->retry_max = (int)timeout/5;

  /* But bound the total number */
  if(state->retry_max<3)
    state->retry_max = 3;

  if(state->retry_max>50)
    state->retry_max = 50;

  /* Compute the re-ACK interval to suit the timeout */
  state->retry_time = (int)(timeout/state->retry_max);
  if(state->retry_time<1)
    state->retry_time = 1;

  infof(state->data,
        "set timeouts for state %d; Total % " CURL_FORMAT_CURL_OFF_T
        ", retry %d maxtry %d",
        (int)state->state, timeout_ms, state->retry_time, state->retry_max);

  /* init RX time */
  time(&state->rx_time);

  return CURLE_OK;
}